

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O0

ParameterizedTestSuiteInfo<rtripflagProblems> *
testing::internal::
CheckedDowncastToActualType<testing::internal::ParameterizedTestSuiteInfo<rtripflagProblems>,testing::internal::ParameterizedTestSuiteInfoBase>
          (ParameterizedTestSuiteInfoBase *base)

{
  bool bVar1;
  ostream *poVar2;
  long local_38;
  bool local_25;
  GTestLog local_14;
  ParameterizedTestSuiteInfo<rtripflagProblems> *local_10;
  ParameterizedTestSuiteInfoBase *base_local;
  
  local_25 = true;
  local_10 = (ParameterizedTestSuiteInfo<rtripflagProblems> *)base;
  if (base != (ParameterizedTestSuiteInfoBase *)0x0) {
    if (base == (ParameterizedTestSuiteInfoBase *)0x0) {
      local_38 = 0;
    }
    else {
      local_38 = __dynamic_cast(base,&ParameterizedTestSuiteInfoBase::typeinfo,
                                &ParameterizedTestSuiteInfo<rtripflagProblems>::typeinfo,0);
    }
    local_25 = local_38 != 0;
  }
  bVar1 = IsTrue(local_25);
  if (!bVar1) {
    GTestLog::GTestLog(&local_14,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/ThirdParty/googletest/googletest/include/gtest/internal/gtest-port.h"
                       ,0x4aa);
    poVar2 = GTestLog::GetStream(&local_14);
    std::operator<<(poVar2,
                    "Condition base == nullptr || dynamic_cast<Derived*>(base) != nullptr failed. ")
    ;
    GTestLog::~GTestLog(&local_14);
  }
  return local_10;
}

Assistant:

Derived* CheckedDowncastToActualType(Base* base) {
  static_assert(std::is_base_of<Base, Derived>::value,
                "target type not derived from source type");
#if GTEST_HAS_RTTI
  GTEST_CHECK_(base == nullptr || dynamic_cast<Derived*>(base) != nullptr);
#endif
  return static_cast<Derived*>(base);
}